

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS ref_split_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  REF_INT ncell;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_INT cell_to_split [100];
  int local_258;
  REF_INT local_254;
  long local_250;
  REF_CELL local_248;
  REF_GRID local_240;
  REF_INT local_238 [28];
  REF_INT local_1c8 [102];
  
  local_248 = ref_grid->cell[8];
  uVar4 = ref_cell_list_with2(local_248,node0,node1,100,&local_258,local_1c8);
  if (uVar4 != 7) {
    if (uVar4 == 0) {
      local_240 = ref_grid;
      if (0 < local_258) {
        lVar8 = 0;
        do {
          pRVar2 = local_248;
          RVar1 = local_1c8[lVar8];
          local_250 = lVar8;
          uVar4 = ref_cell_nodes(local_248,RVar1,local_238);
          if (uVar4 != 0) {
            pcVar11 = "cell nodes";
            uVar10 = 0x19b;
            goto LAB_00209e0d;
          }
          uVar4 = ref_cell_remove(pRVar2,RVar1);
          if (uVar4 != 0) {
            pcVar11 = "remove";
            uVar10 = 0x19c;
            goto LAB_00209e0d;
          }
          iVar5 = pRVar2->node_per;
          if (0 < (long)iVar5) {
            uVar6 = 0;
            do {
              if (local_238[uVar6] == node0) {
                local_238[uVar6] = new_node;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < (ulong)(long)iVar5);
          }
          uVar4 = ref_cell_add(pRVar2,local_238,&local_254);
          if (uVar4 != 0) {
            pcVar11 = "add node0 version";
            uVar10 = 0x1a0;
            goto LAB_00209e0d;
          }
          iVar5 = pRVar2->node_per;
          uVar6 = (ulong)iVar5;
          if (0 < (long)uVar6) {
            uVar7 = 0;
            do {
              if (local_238[uVar7] == new_node) {
                local_238[uVar7] = node0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar6);
            if (0 < iVar5) {
              uVar7 = 0;
              do {
                if (local_238[uVar7] == node1) {
                  local_238[uVar7] = new_node;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar6);
            }
          }
          uVar4 = ref_cell_add(pRVar2,local_238,&local_254);
          if (uVar4 != 0) {
            pcVar11 = "add node1 version";
            uVar10 = 0x1a6;
            goto LAB_00209e0d;
          }
          lVar8 = local_250 + 1;
        } while (lVar8 < local_258);
      }
      pRVar2 = local_240->cell[3];
      uVar4 = ref_cell_list_with2(pRVar2,node0,node1,100,&local_258,local_1c8);
      if (uVar4 == 0) {
        local_250 = CONCAT44(local_250._4_4_,node1);
        if (0 < local_258) {
          lVar8 = 0;
          do {
            RVar1 = local_1c8[lVar8];
            uVar4 = ref_cell_nodes(pRVar2,RVar1,local_238);
            if (uVar4 != 0) {
              pcVar11 = "cell nodes";
              uVar10 = 0x1b0;
              goto LAB_00209e0d;
            }
            uVar4 = ref_cell_remove(pRVar2,RVar1);
            if (uVar4 != 0) {
              pcVar11 = "remove";
              uVar10 = 0x1b1;
              goto LAB_00209e0d;
            }
            iVar5 = pRVar2->node_per;
            iVar3 = (int)local_250;
            if (0 < iVar5) {
              lVar9 = 0;
              do {
                if (local_238[lVar9] == node0) {
                  local_238[lVar9] = new_node;
                  iVar5 = pRVar2->node_per;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < iVar5);
            }
            uVar4 = ref_cell_add(pRVar2,local_238,&local_254);
            if (uVar4 != 0) {
              pcVar11 = "add node0 version";
              uVar10 = 0x1b5;
              goto LAB_00209e0d;
            }
            iVar5 = pRVar2->node_per;
            if (0 < iVar5) {
              lVar9 = 0;
              do {
                if (local_238[lVar9] == new_node) {
                  local_238[lVar9] = node0;
                  iVar5 = pRVar2->node_per;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < iVar5);
              if (0 < iVar5) {
                lVar9 = 0;
                do {
                  if (local_238[lVar9] == iVar3) {
                    local_238[lVar9] = new_node;
                    iVar5 = pRVar2->node_per;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 < iVar5);
              }
            }
            uVar4 = ref_cell_add(pRVar2,local_238,&local_254);
            if (uVar4 != 0) {
              pcVar11 = "add node1 version";
              uVar10 = 0x1bb;
              goto LAB_00209e0d;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < local_258);
        }
        pRVar2 = local_240->cell[0];
        uVar4 = ref_cell_list_with2(pRVar2,node0,(int)local_250,100,&local_258,local_1c8);
        if (uVar4 == 0) {
          if (local_258 < 1) {
            return 0;
          }
          local_248 = (REF_CELL)0x0;
          while( true ) {
            RVar1 = local_1c8[(long)local_248];
            uVar4 = ref_cell_nodes(pRVar2,RVar1,local_238);
            if (uVar4 != 0) {
              pcVar11 = "cell nodes";
              uVar10 = 0x1c5;
              goto LAB_00209e0d;
            }
            uVar4 = ref_cell_remove(pRVar2,RVar1);
            if (uVar4 != 0) break;
            iVar5 = pRVar2->node_per;
            if (0 < iVar5) {
              lVar8 = 0;
              do {
                if (local_238[lVar8] == node0) {
                  local_238[lVar8] = new_node;
                  iVar5 = pRVar2->node_per;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < iVar5);
            }
            uVar4 = ref_cell_add(pRVar2,local_238,&local_254);
            if (uVar4 != 0) {
              pcVar11 = "add node0 version";
              uVar10 = 0x1ca;
              goto LAB_00209e0d;
            }
            iVar5 = pRVar2->node_per;
            if (0 < iVar5) {
              lVar8 = 0;
              do {
                if (local_238[lVar8] == new_node) {
                  local_238[lVar8] = node0;
                  iVar5 = pRVar2->node_per;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < iVar5);
              if (0 < iVar5) {
                lVar8 = 0;
                do {
                  if (local_238[lVar8] == (int)local_250) {
                    local_238[lVar8] = new_node;
                    iVar5 = pRVar2->node_per;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < iVar5);
              }
            }
            uVar4 = ref_cell_add(pRVar2,local_238,&local_254);
            if (uVar4 != 0) {
              pcVar11 = "add node1 version";
              uVar10 = 0x1d0;
              goto LAB_00209e0d;
            }
            local_248 = (REF_CELL)((long)&local_248->type + 1);
            if ((long)local_258 <= (long)local_248) {
              return 0;
            }
          }
          pcVar11 = "remove";
          uVar10 = 0x1c6;
        }
        else {
          pcVar11 = "get edg list, should have been smaller then tets";
          uVar10 = 0x1c1;
        }
      }
      else {
        pcVar11 = "get tri list, should have been smaller then tets";
        uVar10 = 0x1ac;
      }
    }
    else {
      pcVar11 = "tet list to split";
      uVar10 = 0x197;
    }
LAB_00209e0d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar10,
           "ref_split_edge",(ulong)uVar4,pcVar11);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_split[MAX_CELL_SPLIT];
  REF_INT node, new_cell;
  REF_STATUS status;

  ref_cell = ref_grid_tet(ref_grid);
  status = ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                               cell_to_split);
  if (REF_INCREASE_LIMIT == status) return status;
  RSS(status, "tet list to split");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get tri list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get edg list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  return REF_SUCCESS;
}